

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O0

bool __thiscall
SphereTriangleDetector::pointInTriangle
          (SphereTriangleDetector *this,btVector3 *vertices,btVector3 *normal,btVector3 *p)

{
  long in_RSI;
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  btScalar r3;
  btScalar r2;
  btScalar r1;
  btVector3 edge3_normal;
  btVector3 edge2_normal;
  btVector3 edge1_normal;
  btVector3 p3_to_p;
  btVector3 p2_to_p;
  btVector3 p1_to_p;
  btVector3 edge3;
  btVector3 edge2;
  btVector3 edge1;
  btVector3 *p3;
  btVector3 *p2;
  btVector3 *p1;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  btVector3 *in_stack_ffffffffffffff30;
  btVector3 local_c0;
  btVector3 local_b0;
  btVector3 local_a0;
  btVector3 local_90;
  btVector3 local_80;
  btScalar local_70 [4];
  btScalar local_60 [4];
  btScalar local_50 [4];
  long local_40;
  long local_38;
  bool local_1;
  
  local_38 = in_RSI + 0x10;
  local_40 = in_RSI + 0x20;
  local_50 = (btScalar  [4])
             operator-(in_stack_ffffffffffffff30,
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_60 = (btScalar  [4])
             operator-(in_stack_ffffffffffffff30,
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_70 = (btScalar  [4])
             operator-(in_stack_ffffffffffffff30,
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_80 = operator-(in_stack_ffffffffffffff30,
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_90 = operator-(in_stack_ffffffffffffff30,
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_a0 = operator-(in_stack_ffffffffffffff30,
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_b0 = btVector3::cross(in_stack_ffffffffffffff30,
                              (btVector3 *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_c0 = btVector3::cross(in_stack_ffffffffffffff30,
                              (btVector3 *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  btVector3::cross(in_stack_ffffffffffffff30,
                   (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar1 = btVector3::dot(&local_b0,&local_80);
  bVar2 = btVector3::dot(&local_c0,&local_90);
  bVar3 = btVector3::dot((btVector3 *)&stack0xffffffffffffff30,&local_a0);
  if ((((0.0 < bVar1) && (0.0 < bVar2)) && (0.0 < bVar3)) ||
     (((bVar1 <= 0.0 && (bVar2 <= 0.0)) && (bVar3 <= 0.0)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SphereTriangleDetector::pointInTriangle(const btVector3 vertices[], const btVector3 &normal, btVector3 *p )
{
	const btVector3* p1 = &vertices[0];
	const btVector3* p2 = &vertices[1];
	const btVector3* p3 = &vertices[2];

	btVector3 edge1( *p2 - *p1 );
	btVector3 edge2( *p3 - *p2 );
	btVector3 edge3( *p1 - *p3 );

	btVector3 p1_to_p( *p - *p1 );
	btVector3 p2_to_p( *p - *p2 );
	btVector3 p3_to_p( *p - *p3 );

	btVector3 edge1_normal( edge1.cross(normal));
	btVector3 edge2_normal( edge2.cross(normal));
	btVector3 edge3_normal( edge3.cross(normal));
	
	btScalar r1, r2, r3;
	r1 = edge1_normal.dot( p1_to_p );
	r2 = edge2_normal.dot( p2_to_p );
	r3 = edge3_normal.dot( p3_to_p );
	if ( ( r1 > 0 && r2 > 0 && r3 > 0 ) ||
	     ( r1 <= 0 && r2 <= 0 && r3 <= 0 ) )
		return true;
	return false;

}